

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

upb_StringView upb_strtable_iter_key(upb_strtable_iter *i)

{
  upb_StringView uVar1;
  _Bool _Var2;
  upb_tabent *puVar3;
  char *pcVar4;
  uint32_t local_24;
  upb_strtable_iter *puStack_20;
  uint32_t len;
  upb_strtable_iter *i_local;
  upb_StringView key;
  
  puStack_20 = i;
  _Var2 = upb_strtable_done(i);
  if (!_Var2) {
    puVar3 = str_tabent(puStack_20);
    pcVar4 = upb_tabstr(puVar3->key,&local_24);
    uVar1.size._0_4_ = local_24;
    uVar1.data = pcVar4;
    uVar1.size._4_4_ = 0;
    return uVar1;
  }
  __assert_fail("!upb_strtable_done(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                ,0x1f9,"upb_StringView upb_strtable_iter_key(const upb_strtable_iter *)");
}

Assistant:

upb_StringView upb_strtable_iter_key(const upb_strtable_iter* i) {
  upb_StringView key;
  uint32_t len;
  UPB_ASSERT(!upb_strtable_done(i));
  key.data = upb_tabstr(str_tabent(i)->key, &len);
  key.size = len;
  return key;
}